

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

function<void_(const_QtPromisePrivate::PromiseError_&)> * __thiscall
QtPromisePrivate::PromiseCatcher<float,std::function<float(QString_const&)>,QString_const&>::
create<QtPromise::QPromiseResolve<float>,QtPromise::QPromiseReject<float>>
          (function<void_(const_QtPromisePrivate::PromiseError_&)> *__return_storage_ptr__,
          PromiseCatcher<float,std::function<float(QString_const&)>,QString_const&> *this,
          function<float_(const_QString_&)> *handler,QPromiseResolve<float> *resolve,
          QPromiseReject<float> *reject)

{
  anon_class_48_3_a63a5800 local_58;
  QPromiseReject<float> *local_28;
  QPromiseReject<float> *reject_local;
  QPromiseResolve<float> *resolve_local;
  function<float_(const_QString_&)> *handler_local;
  
  local_28 = (QPromiseReject<float> *)resolve;
  reject_local = (QPromiseReject<float> *)handler;
  resolve_local = (QPromiseResolve<float> *)this;
  handler_local = (function<float_(const_QString_&)> *)__return_storage_ptr__;
  QtPromise::QPromiseResolve<float>::QPromiseResolve
            (&local_58.resolve,(QPromiseResolve<float> *)handler);
  QtPromise::QPromiseReject<float>::QPromiseReject(&local_58.reject,local_28);
  std::function<float_(const_QString_&)>::function
            (&local_58.handler,(function<float_(const_QString_&)> *)resolve_local);
  std::function<void(QtPromisePrivate::PromiseError_const&)>::
  function<QtPromisePrivate::PromiseCatcher<float,std::function<float(QString_const&)>,QString_const&>::create<QtPromise::QPromiseResolve<float>,QtPromise::QPromiseReject<float>>(std::function<float(QString_const&)>const&,QtPromise::QPromiseResolve<float>const&,QtPromise::QPromiseReject<float>const&)::_lambda(QtPromisePrivate::PromiseError_const&)_1_,void>
            ((function<void(QtPromisePrivate::PromiseError_const&)> *)__return_storage_ptr__,
             &local_58);
  create<QtPromise::QPromiseResolve<float>,QtPromise::QPromiseReject<float>>(std::function<float(QString_const&)>const&,QtPromise::QPromiseResolve<float>const&,QtPromise::QPromiseReject<float>const&)
  ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~create
            ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

static std::function<void(const PromiseError&)>
    create(const THandler& handler, const TResolve& resolve, const TReject& reject)
    {
        return [=](const PromiseError& error) {
            try {
                error.rethrow();
            } catch (const TArg& argError) {
                PromiseDispatch<ResType>::call(resolve, reject, handler, argError);
            } catch (...) {
                reject(std::current_exception());
            }
        };
    }